

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

void gdImageGifAnimAddCtx
               (gdImagePtr im,gdIOCtxPtr out,int LocalCM,int LeftOfs,int TopOfs,int Delay,
               int Disposal,gdImagePtr previm)

{
  int iVar1;
  int iVar2;
  int iVar3;
  gdImagePtr im_00;
  long lVar4;
  gdImagePtr to;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  gdImagePtr from;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int local_c570;
  int local_c568;
  gdImagePtr local_c550;
  int colorMap [256];
  
  iVar1 = im->interlace;
  iVar10 = im->transparent;
  if (im->trueColor == 0) {
    local_c550 = (gdImagePtr)0x0;
  }
  else {
    local_c550 = gdImageCreatePaletteFromTrueColor(im,1,0x100);
    im = local_c550;
    if (local_c550 == (gdImagePtr)0x0) {
      return;
    }
  }
  local_c570 = iVar10;
  if (previm != (gdImagePtr)0x0) {
    uVar9 = im->sy;
    if (previm->trueColor == 0) {
      im_00 = (gdImagePtr)0x0;
    }
    else {
      im_00 = gdImageCreatePaletteFromTrueColor(previm,1,0x100);
      previm = im_00;
      if (im_00 == (gdImagePtr)0x0) goto LAB_00118718;
    }
    lVar4 = 0;
    do {
      (colorMap + lVar4)[0] = -2;
      (colorMap + lVar4)[1] = -2;
      (colorMap + lVar4 + 2)[0] = -2;
      (colorMap + lVar4 + 2)[1] = -2;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x100);
    uVar13 = im->sy;
    if (0 < (int)uVar13) {
      uVar5 = (ulong)(uint)im->sx;
      uVar14 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar12 = 0;
          do {
            iVar2 = comparewithmap(previm,im,(uint)previm->pixels[uVar14][uVar12],
                                   (uint)im->pixels[uVar14][uVar12],colorMap);
            if (iVar2 == 0) {
              uVar13 = im->sy;
              uVar9 = (uint)uVar14;
              goto LAB_001180ed;
            }
            uVar12 = uVar12 + 1;
            uVar5 = (ulong)im->sx;
          } while ((long)uVar12 < (long)uVar5);
          uVar13 = im->sy;
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)(int)uVar13);
    }
    uVar12 = 0;
    uVar14 = 0;
LAB_001180ed:
    uVar11 = (uint)uVar12;
    local_c568 = 0;
    uVar15 = 0;
    LeftOfs = 1;
    local_c570 = 0;
    TopOfs = 1;
    if (uVar13 == uVar9) {
LAB_00118317:
      iVar10 = (uVar15 - LeftOfs) + 1;
      iVar2 = (local_c568 - TopOfs) + 1;
      to = gdImageCreate(iVar10,iVar2);
      if (to == (gdImagePtr)0x0) {
        if (im_00 != (gdImagePtr)0x0) {
          gdImageDestroy(im_00);
        }
        goto LAB_00118718;
      }
      from = im;
      if (LocalCM < 1) {
        from = previm;
      }
      gdImagePaletteCopy(to,from);
      gdImageCopy(to,im,0,0,LeftOfs,TopOfs,iVar10,iVar2);
      if (local_c550 != (gdImagePtr)0x0) {
        gdImageDestroy(local_c550);
      }
      im = to;
      if ((-1 < local_c570) && (iVar10 = to->sy, 0 < iVar10)) {
        lVar4 = 0;
        do {
          if (0 < (long)to->sx) {
            lVar7 = 0;
            do {
              if (previm->pixels[lVar4 + TopOfs][lVar7 + LeftOfs] == to->pixels[lVar4][lVar7]) {
                gdImageSetPixel(to,(int)lVar7,(int)lVar4,local_c570);
                iVar10 = to->sy;
                break;
              }
              lVar7 = lVar7 + 1;
            } while (to->sx != lVar7);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar10);
      }
    }
    else {
      if ((int)uVar9 < (int)(uVar13 - 1)) {
        uVar6 = (ulong)(int)(uVar13 - 1);
        uVar5 = (ulong)(uint)im->sx;
        do {
          if (0 < (int)uVar5) {
            uVar16 = 0;
            do {
              iVar2 = comparewithmap(previm,im,(uint)previm->pixels[uVar6][uVar16],
                                     (uint)im->pixels[uVar6][uVar16],colorMap);
              if (iVar2 == 0) {
                uVar15 = (uint)uVar16;
                uVar13 = uVar11;
                if (uVar15 < uVar11) {
                  uVar13 = uVar15;
                }
                if (uVar11 < uVar15) {
                  uVar12 = uVar16;
                }
                uVar15 = (uint)uVar12;
                uVar12 = (ulong)uVar13;
                goto LAB_00118193;
              }
              uVar16 = uVar16 + 1;
              uVar5 = (ulong)im->sx;
            } while ((long)uVar16 < (long)uVar5);
          }
          uVar6 = uVar6 - 1;
        } while ((long)(int)uVar9 < (long)uVar6);
      }
      uVar6 = uVar14 & 0xffffffff;
      uVar15 = uVar11;
LAB_00118193:
      LeftOfs = (int)uVar12;
      local_c568 = (int)uVar6;
      if (0 < LeftOfs) {
        uVar5 = 0;
        do {
          lVar4 = (long)(int)uVar9;
          iVar2 = (local_c568 - uVar9) + 1;
          if ((int)uVar9 <= local_c568) {
            do {
              iVar3 = comparewithmap(previm,im,(uint)previm->pixels[lVar4][uVar5],
                                     (uint)im->pixels[lVar4][uVar5],colorMap);
              if (iVar3 == 0) {
                LeftOfs = (int)uVar5;
                goto LAB_00118233;
              }
              lVar4 = lVar4 + 1;
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uVar12 & 0xffffffff));
      }
LAB_00118233:
      if ((int)uVar15 < im->sx + -1) {
        lVar4 = (long)im->sx + -1;
        do {
          lVar7 = (long)(int)uVar9;
          iVar2 = (local_c568 - uVar9) + 1;
          if ((int)uVar9 <= local_c568) {
            do {
              iVar3 = comparewithmap(previm,im,(uint)previm->pixels[lVar7][lVar4],
                                     (uint)im->pixels[lVar7][lVar4],colorMap);
              if (iVar3 == 0) {
                uVar15 = (uint)lVar4;
                goto LAB_001182bd;
              }
              lVar7 = lVar7 + 1;
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
          lVar4 = lVar4 + -1;
        } while ((int)uVar15 < lVar4);
      }
LAB_001182bd:
      local_c570 = iVar10;
      TopOfs = uVar9;
      if (((LeftOfs != 0) || (LeftOfs = 0, uVar9 != 0)) || (uVar15 != im->sx - 1U))
      goto LAB_00118317;
      LeftOfs = 0;
      TopOfs = 0;
      if (-1 < iVar10 || local_c568 != im->sy + -1) goto LAB_00118317;
      TopOfs = 0;
      LeftOfs = 0;
      to = local_c550;
    }
    if (im_00 != (gdImagePtr)0x0) {
      gdImageDestroy(im_00);
    }
    Disposal = 1;
    local_c550 = to;
  }
  uVar9 = im->colorsTotal;
  uVar13 = 1;
  if ((((2 < (int)uVar9) && (uVar13 = 2, 4 < uVar9)) &&
      ((uVar13 = 3, 8 < uVar9 &&
       (((uVar13 = 4, 0x10 < uVar9 && (uVar13 = 5, 0x20 < uVar9)) && (uVar13 = 6, 0x40 < uVar9))))))
     && (uVar13 = 7, 0x80 < uVar9)) {
    uVar13 = (uint)(uVar9 < 0x101) << 3;
  }
  iVar10 = im->sx;
  iVar2 = im->sy;
  memset(colorMap + 8,0,0xc4c0);
  uVar9 = 0;
  if (LeftOfs < 1) {
    LeftOfs = uVar9;
  }
  if (TopOfs < 1) {
    TopOfs = uVar9;
  }
  iVar3 = 100;
  if (-1 < Delay) {
    iVar3 = Delay;
  }
  bVar8 = (char)Disposal * '\x04';
  colorMap._16_8_ = (long)iVar2 * (long)iVar10;
  colorMap[6] = 0;
  colorMap[2] = 0;
  colorMap[3] = 0;
  colorMap[0] = iVar10;
  colorMap[1] = iVar2;
  colorMap[7] = iVar1;
  gdPutC('!',out);
  gdPutC(0xf9,out);
  gdPutC('\x04',out);
  if (Disposal < 0) {
    bVar8 = 4;
  }
  gdPutC(bVar8 | (byte)~(byte)((uint)local_c570 >> 0x18) >> 7,out);
  gdPutC((uchar)iVar3,out);
  gdPutC((uchar)((uint)iVar3 >> 8),out);
  gdPutC((uchar)local_c570,out);
  gdPutC('\0',out);
  gdPutC(',',out);
  gdPutC((uchar)LeftOfs,out);
  gdPutC((uchar)((uint)LeftOfs >> 8),out);
  gdPutC((uchar)TopOfs,out);
  gdPutC((uchar)((uint)TopOfs >> 8),out);
  gdPutC((uchar)iVar10,out);
  gdPutC((uchar)((uint)iVar10 >> 8),out);
  gdPutC((uchar)iVar2,out);
  gdPutC((uchar)((uint)iVar2 >> 8),out);
  uVar15 = uVar13 + 0x7f | 0x80;
  if (LocalCM < 1) {
    uVar15 = uVar9;
  }
  gdPutC((byte)uVar15 | (iVar1 != 0) << 6,out);
  if (0 < LocalCM) {
    lVar4 = 0;
    do {
      gdPutC((uchar)im->red[lVar4],out);
      gdPutC((uchar)im->green[lVar4],out);
      gdPutC((uchar)im->blue[lVar4],out);
      lVar4 = lVar4 + 1;
    } while ((uint)lVar4 >> (sbyte)uVar13 == 0);
  }
  uVar9 = 2;
  if (2 < uVar13) {
    uVar9 = uVar13;
  }
  gdPutC((uchar)uVar9,out);
  compress(uVar9 + 1,out,im,(GifCtx *)colorMap);
  gdPutC('\0',out);
LAB_00118718:
  if (local_c550 != (gdImagePtr)0x0) {
    gdImageDestroy(local_c550);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimAddCtx(gdImagePtr im, gdIOCtxPtr out,
                                       int LocalCM, int LeftOfs, int TopOfs,
                                       int Delay, int Disposal,
                                       gdImagePtr previm)
{
	gdImagePtr pim = NULL, tim = im;
	int interlace, transparent, BitsPerPixel;
	interlace = im->interlace;
	transparent = im->transparent;

	/* Default is no local color map */
	if(LocalCM < 0) {
		LocalCM = 0;
	}

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
			acceptable result: mix down to a palette
			based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if (!pim) {
			return;
		}
		tim = pim;
	}

	if (previm) {
		/* create optimized animation.  Compare this image to
		   the previous image and crop the temporary copy of
		   current image to include only changed rectangular
		   area.  Also replace unchanged pixels inside this
		   area with transparent color.  Transparent color
		   needs to be already allocated!
		   Preconditions:
		   TopOfs, LeftOfs are assumed 0

		   Images should be of same size.  If not, a temporary
		   copy is made with the same size as previous image.

		*/
		gdImagePtr prev_pim = 0, prev_tim = previm;
		int x, y;
		int min_x = 0;
		int min_y = tim->sy;
		int max_x = 0;
		int max_y = 0;
		int colorMap[256];

		if (previm->trueColor) {
			prev_pim = gdImageCreatePaletteFromTrueColor(previm, 1, 256);
			if (!prev_pim) {
				goto fail_end;
			}
			prev_tim = prev_pim;
		}

		for (x = 0; x < 256; ++x) {
			colorMap[x] = -2;
		}

		/* First find bounding box of changed areas. */
		/* first find the top changed row */
		for (y = 0; y < tim->sy; ++y) {
			for (x = 0; x < tim->sx; ++x) {
				if (!comparewithmap(prev_tim, tim,
				                    prev_tim->pixels[y][x],
				                    tim->pixels[y][x],
				                    colorMap)) {
					min_y = max_y = y;
					min_x = max_x = x;
					goto break_top;
				}
			}
		}

break_top:
		if (tim->sy == min_y) {
			/* No changes in this frame!! Encode empty image. */
			transparent = 0;
			min_x = min_y = 1;
			max_x = max_y = 0;
		} else {
			/* Then the bottom row */
			for (y = tim->sy - 1; y > min_y; --y) {
				for (x = 0; x < tim->sx; ++x) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_y = y;
						if(x < min_x) {
							min_x = x;
						}
						if(x > max_x) {
							max_x = x;
						}
						goto break_bot;
					}
				}
			}

break_bot:
			/* left side */
			for (x = 0; x < min_x; ++x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						min_x = x;
						goto break_left;
					}
				}
			}

break_left:
			/* right side */
			for (x = tim->sx - 1; x > max_x; --x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_x = x;
						goto break_right;
					}
				}
			}

break_right:
			;
		}

		LeftOfs = min_x;
		TopOfs = min_y;
		Disposal = 1;

		/* Make a copy of the image with the new offsets.
		   But only if necessary. */
		if (min_x != 0 || max_x != tim->sx - 1
		        || min_y != 0 || max_y != tim->sy - 1
		        || transparent >= 0) {

			gdImagePtr pim2 = gdImageCreate(max_x-min_x + 1, max_y-min_y + 1);

			if (!pim2) {
				if (prev_pim) {
					gdImageDestroy(prev_pim);
				}
				goto fail_end;
			}

			gdImagePaletteCopy(pim2, LocalCM ? tim : prev_tim);
			gdImageCopy(pim2, tim, 0, 0, min_x, min_y,
			            max_x - min_x + 1, max_y - min_y + 1);

			if (pim) {
				gdImageDestroy(pim);
			}

			tim = pim = pim2;
		}

		/* now let's compare pixels for transparent
		   optimization.  But only if transparent is set. */
		if (transparent >= 0) {
			for(y = 0; y < tim->sy; ++y) {
				for (x = 0; x < tim->sx; ++x) {
					if(comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[min_y + y][min_x + x],
					         tim->pixels[y][x], 0)) {
						gdImageSetPixel(tim, x, y, transparent);
						break;
					}
				}
			}
		}

		if(prev_pim) {
			gdImageDestroy(prev_pim);
		}
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFAnimEncode(
	    out, tim->sx, tim->sy, LeftOfs, TopOfs, interlace, transparent,
	    Delay, Disposal, BitsPerPixel,
	    LocalCM ? tim->red : 0, tim->green, tim->blue, tim);

fail_end:
	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(pim);
	}
}